

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O3

int __thiscall asmjit::Assembler::bind(Assembler *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long *plVar1;
  CodeHolder *pCVar2;
  long lVar3;
  Logger *pLVar4;
  Slot *pSVar5;
  uint8_t *puVar6;
  Error EVar7;
  long lVar8;
  socklen_t __len_00;
  socklen_t extraout_EDX;
  ulong uVar9;
  Slot *extraout_RDX;
  undefined4 in_register_00000034;
  sockaddr *psVar11;
  Assembler *pAVar12;
  sockaddr *psVar13;
  uint8_t uVar14;
  int iVar15;
  long lVar16;
  StringBuilderTmp<256UL> sb;
  StringBuilder local_148;
  char local_128 [264];
  Slot *pSVar10;
  
  __len_00 = (socklen_t)__addr;
  psVar11 = (sockaddr *)CONCAT44(in_register_00000034,__fd);
  EVar7 = (this->super_CodeEmitter)._lastError;
  if (EVar7 != 0) {
    return EVar7;
  }
  pCVar2 = (this->super_CodeEmitter)._code;
  pAVar12 = this;
  if (pCVar2 == (CodeHolder *)0x0) {
LAB_00159876:
    bind((int)pAVar12,psVar11,__len_00);
  }
  else {
    uVar9 = (ulong)(*(int *)(psVar11->sa_data + 2) - 0x100);
    if (((pCVar2->_labels).super_ZoneVectorBase._length <= uVar9) ||
       (lVar3 = *(long *)((long)(pCVar2->_labels).super_ZoneVectorBase._data + uVar9 * 8),
       lVar3 == 0)) {
      EVar7 = 0xc;
      goto LAB_001596f5;
    }
    if (*(int *)(lVar3 + 0x18) == -1) {
      if (((this->super_CodeEmitter)._globalOptions & 4) != 0) {
        local_148._data = local_128;
        local_128[0] = '\0';
        local_148._length = 0;
        local_148._capacity = 0x100;
        local_148._canFree = 0;
        if (*(uint *)(lVar3 + 0x30) == 0) {
          StringBuilder::setFormat(&local_148,"L%u:");
        }
        else {
          if (*(uint *)(lVar3 + 0x30) < 0xc) {
            lVar8 = lVar3 + 0x34;
          }
          else {
            lVar8 = *(long *)(lVar3 + 0x38);
          }
          StringBuilder::setFormat(&local_148,"%s:",lVar8);
        }
        Logging::formatLine(&local_148,(uint8_t *)0x0,
                            (ulong)(((this->super_CodeEmitter)._code)->_logger->_options & 1) - 1,0,
                            0,(this->super_CodeEmitter)._inlineComment);
        pLVar4 = ((this->super_CodeEmitter)._code)->_logger;
        (*pLVar4->_vptr_Logger[2])(pLVar4,local_148._data,local_148._length);
        StringBuilder::~StringBuilder(&local_148);
      }
      psVar11 = (sockaddr *)0x0;
      lVar8 = (long)this->_bufferPtr - (long)this->_bufferData;
      if (*(Slot **)(lVar3 + 0x28) != (Slot *)0x0) {
        pAVar12 = (Assembler *)0xffffffff;
        pSVar10 = *(Slot **)(lVar3 + 0x28);
        psVar13 = (sockaddr *)0x0;
        do {
          psVar11 = (sockaddr *)(ulong)*(uint *)((long)&pSVar10[1].next + 4);
          if (psVar11 != (sockaddr *)0xffffffff) {
            pCVar2 = (this->super_CodeEmitter)._code;
            if (psVar11 < (sockaddr *)(pCVar2->_relocations).super_ZoneVectorBase._length) {
              plVar1 = (long *)(*(long *)((long)(pCVar2->_relocations).super_ZoneVectorBase._data +
                                         (long)psVar11 * 8) + 0x18);
              *plVar1 = *plVar1 + lVar8;
              psVar11 = psVar13;
              goto LAB_001597ca;
            }
LAB_00159871:
            bind((int)pAVar12,psVar11,(socklen_t)pSVar10);
            __len_00 = extraout_EDX;
            goto LAB_00159876;
          }
          pSVar5 = pSVar10[2].next;
          puVar6 = this->_bufferData;
          lVar16 = (lVar8 - (long)pSVar5) + (long)pSVar10[3].next;
          iVar15 = (int)lVar16;
          psVar11 = (sockaddr *)0x2a;
          if (puVar6[(long)pSVar5] == '\x01') {
            uVar14 = (uint8_t)lVar16;
            if ((char)uVar14 == iVar15) {
              puVar6[(long)pSVar5] = uVar14;
              psVar11 = psVar13;
            }
          }
          else if (puVar6[(long)pSVar5] == '\x04') {
            *(int *)(puVar6 + (long)pSVar5) = iVar15;
            psVar11 = psVar13;
          }
LAB_001597ca:
          pCVar2 = (this->super_CodeEmitter)._code;
          pSVar5 = pSVar10->next;
          pCVar2->_unresolvedLabelsCount = pCVar2->_unresolvedLabelsCount - 1;
          if ((pCVar2->_baseHeap)._zone == (Zone *)0x0) {
            bind(-1,psVar11,(socklen_t)pSVar10);
            pSVar10 = extraout_RDX;
            goto LAB_00159871;
          }
          pSVar10->next = (pCVar2->_baseHeap)._slots[0];
          (pCVar2->_baseHeap)._slots[0] = pSVar10;
          pSVar10 = pSVar5;
          psVar13 = psVar11;
        } while (pSVar5 != (Slot *)0x0);
      }
      *(uint32_t *)(lVar3 + 0x18) = this->_section->_id;
      *(long *)(lVar3 + 0x20) = lVar8;
      *(undefined8 *)(lVar3 + 0x28) = 0;
      (this->super_CodeEmitter)._inlineComment = (char *)0x0;
      if ((Error)psVar11 == 0) {
        return 0;
      }
      EVar7 = CodeEmitter::setLastError(&this->super_CodeEmitter,(Error)psVar11,(char *)0x0);
      return EVar7;
    }
  }
  EVar7 = 0xe;
LAB_001596f5:
  EVar7 = CodeEmitter::setLastError(&this->super_CodeEmitter,EVar7,(char *)0x0);
  return EVar7;
}

Assistant:

Error Assembler::bind(const Label& label) {
  if (_lastError) return _lastError;
  ASMJIT_ASSERT(_code != nullptr);

  LabelEntry* le = _code->getLabelEntry(label);
  if (ASMJIT_UNLIKELY(!le))
    return setLastError(DebugUtils::errored(kErrorInvalidLabel));

  // Label can be bound only once.
  if (ASMJIT_UNLIKELY(le->isBound()))
    return setLastError(DebugUtils::errored(kErrorLabelAlreadyBound));

#if !defined(ASMJIT_DISABLE_LOGGING)
  if (_globalOptions & kOptionLoggingEnabled) {
    StringBuilderTmp<256> sb;
    if (le->hasName())
      sb.setFormat("%s:", le->getName());
    else
      sb.setFormat("L%u:", Operand::unpackId(label.getId()));

    size_t binSize = 0;
    if (!_code->_logger->hasOption(Logger::kOptionBinaryForm))
      binSize = Globals::kInvalidIndex;

    Logging::formatLine(sb, nullptr, binSize, 0, 0, getInlineComment());
    _code->_logger->log(sb.getData(), sb.getLength());
  }
#endif // !ASMJIT_DISABLE_LOGGING

  Error err = kErrorOk;
  size_t pos = getOffset();

  LabelLink* link = le->_links;
  LabelLink* prev = nullptr;

  while (link) {
    intptr_t offset = link->offset;
    uint32_t relocId = link->relocId;

    if (relocId != RelocEntry::kInvalidId) {
      // Adjust relocation data.
      RelocEntry* re = _code->_relocations[relocId];
      re->_data += static_cast<uint64_t>(pos);
    }
    else {
      // Not using relocId, this means that we are overwriting a real
      // displacement in the CodeBuffer.
      int32_t patchedValue = static_cast<int32_t>(
        static_cast<intptr_t>(pos) - offset + link->rel);

      // Size of the value we are going to patch. Only BYTE/DWORD is allowed.
      uint32_t size = _bufferData[offset];
      if (size == 4)
        Utils::writeI32u(_bufferData + offset, static_cast<int32_t>(patchedValue));
      else if (size == 1 && Utils::isInt8(patchedValue))
        _bufferData[offset] = static_cast<uint8_t>(patchedValue & 0xFF);
      else
        err = DebugUtils::errored(kErrorInvalidDisplacement);
    }

    prev = link->prev;
    _code->_unresolvedLabelsCount--;
    _code->_baseHeap.release(link, sizeof(LabelLink));

    link = prev;
  }

  // Set as bound.
  le->_sectionId = _section->getId();
  le->_offset = pos;
  le->_links = nullptr;
  resetInlineComment();

  if (err != kErrorOk)
    return setLastError(err);

  return kErrorOk;
}